

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O3

void __thiscall
VertexAttrib64Bit::LimitTest::setAttributes_a_scalar
          (LimitTest *this,attributeConfiguration *configuration,GLint n_type,GLuint vertex,
          vector<double,_std::allocator<double>_> *out_buffer_data)

{
  pointer pdVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar3 = configuration->m_n_attributes_per_group;
  uVar2 = (ulong)uVar3;
  if (n_type < 1) {
    iVar4 = 0;
  }
  else {
    uVar6 = 0;
    iVar4 = 0;
    do {
      iVar4 = iVar4 + configuration->m_n_elements[uVar6] * uVar3;
      uVar6 = uVar6 + 1;
    } while ((uint)n_type != uVar6);
  }
  if (0 < (int)uVar3) {
    uVar5 = iVar4 + vertex * configuration->m_vertex_length;
    uVar3 = n_type * uVar3 + vertex * 2;
    pdVar1 = (out_buffer_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    do {
      pdVar1[uVar5] = (double)uVar3;
      uVar3 = uVar3 + 1;
      uVar5 = uVar5 + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return;
}

Assistant:

void LimitTest::setAttributes_a_scalar(const attributeConfiguration& configuration, GLint n_type, GLuint vertex,
									   std::vector<GLdouble>& out_buffer_data) const
{
	const GLint n_attributes	= configuration.m_n_attributes_per_group;
	const GLint attribute_index = n_attributes * n_type;
	GLuint		vertex_offset   = vertex * configuration.m_vertex_length;

	const GLint group_offset = calculateAttributeGroupOffset(configuration, n_type) + vertex_offset;

	/* Double attributes should be assigned the value:
	 (n_attribute + gl_VertexID * 2) */

	for (GLint attribute = 0; attribute < n_attributes; ++attribute)
	{
		const GLuint attribute_offset = attribute + group_offset;

		out_buffer_data[attribute_offset] = attribute + attribute_index + vertex * 2;
	}
}